

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O3

int xmlC14NProcessAttrsAxis(xmlC14NCtxPtr ctx,xmlNodePtr cur,int parent_visible)

{
  xmlC14NMode xVar1;
  xmlNodePtr pxVar2;
  int iVar3;
  uint uVar4;
  xmlListPtr l;
  void *pvVar5;
  xmlNodePtr data;
  xmlChar *URI;
  xmlAttrPtr pxVar6;
  xmlChar *pxVar7;
  xmlChar *base;
  xmlChar *in_RCX;
  char *extra;
  _xmlNode *p_Var8;
  xmlNodePtr pxVar9;
  _xmlAttr *data_00;
  bool bVar10;
  xmlNodePtr local_40;
  xmlNodePtr local_38;
  
  if (cur->type != XML_ELEMENT_NODE) {
    xmlC14NErrParam("processing attributes axis");
    return -1;
  }
  l = xmlListCreate((xmlListDeallocator)0x0,xmlC14NAttrsCompare);
  if (l == (xmlListPtr)0x0) {
    xmlC14NErrInternal("creating attributes list");
    return -1;
  }
  xVar1 = ctx->mode;
  if (xVar1 == XML_C14N_1_1) {
    pxVar9 = (xmlNodePtr)cur->properties;
    if (pxVar9 == (xmlNodePtr)0x0) {
      data = (xmlNodePtr)0x0;
      local_40 = (xmlNodePtr)0x0;
      if (parent_visible == 0) goto LAB_00138a25;
LAB_0013880d:
      local_38 = (xmlNodePtr)xmlC14NFindHiddenParentAttr(ctx,cur->parent,"lang",in_RCX);
      if (local_38 != (xmlNodePtr)0x0) {
LAB_00138829:
        xmlListInsert(l,local_38);
      }
      if ((data != (xmlNodePtr)0x0) ||
         (data = (xmlNodePtr)xmlC14NFindHiddenParentAttr(ctx,cur->parent,"space",in_RCX),
         data != (xmlNodePtr)0x0)) {
        xmlListInsert(l,data);
      }
      if ((local_40 != (xmlNodePtr)0x0) ||
         (local_40 = (xmlNodePtr)xmlC14NFindHiddenParentAttr(ctx,cur->parent,"base",in_RCX),
         local_40 != (xmlNodePtr)0x0)) {
        if (local_40->parent == (_xmlNode *)0x0) {
          xmlC14NErrParam("processing xml:base attribute");
        }
        else {
          URI = xmlNodeListGetString(ctx->doc,local_40->children,1);
          if (URI == (xmlChar *)0x0) {
LAB_00138a17:
            extra = "processing xml:base attribute - can\'t get attr value";
          }
          else {
            pxVar9 = local_40->parent->parent;
            while (((pxVar9 != (xmlNodePtr)0x0 &&
                    (ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0)) &&
                   (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,pxVar9->parent),
                   iVar3 == 0))) {
              pxVar6 = xmlHasNsProp(pxVar9,"base",(xmlChar *)"http://www.w3.org/XML/1998/namespace")
              ;
              pxVar7 = URI;
              if (pxVar6 != (xmlAttrPtr)0x0) {
                pxVar7 = xmlNodeListGetString(ctx->doc,pxVar6->children,1);
                if (pxVar7 == (xmlChar *)0x0) {
                  (*xmlFree)(URI);
                  goto LAB_00138a17;
                }
                uVar4 = xmlStrlen(pxVar7);
                base = pxVar7;
                if (((1 < (int)uVar4) && (pxVar7[(ulong)uVar4 - 2] == '.')) &&
                   (base = xmlStrcat(pxVar7,"/"), base == (xmlChar *)0x0)) {
                  (*xmlFree)(pxVar7);
                  (*xmlFree)(URI);
                  extra = "processing xml:base attribute - can\'t modify uri";
                  goto LAB_00138a1e;
                }
                pxVar7 = xmlBuildURI(URI,base);
                (*xmlFree)(base);
                (*xmlFree)(URI);
                if (pxVar7 == (xmlChar *)0x0) {
                  extra = "processing xml:base attribute - can\'t construct uri";
                  goto LAB_00138a1e;
                }
              }
              pxVar9 = pxVar9->parent;
              URI = pxVar7;
            }
            iVar3 = xmlStrEqual(URI,"");
            if (iVar3 != 0) {
              (*xmlFree)(URI);
              goto LAB_00138a23;
            }
            local_40 = (xmlNodePtr)xmlNewNsProp((xmlNodePtr)0x0,local_40->ns,"base",URI);
            (*xmlFree)(URI);
            if (local_40 != (xmlNodePtr)0x0) {
              xmlListInsert(l,local_40);
              local_40->next = (_xmlNode *)0x0;
              goto LAB_00138a25;
            }
            extra = "processing xml:base attribute - can\'t construct attribute";
          }
LAB_00138a1e:
          xmlC14NErrInternal(extra);
        }
      }
    }
    else {
      data = (xmlNodePtr)0x0;
      local_38 = (xmlNodePtr)0x0;
      local_40 = (xmlNodePtr)0x0;
      do {
        if (((parent_visible == 0) || (pxVar9->ns == (xmlNsPtr)0x0)) ||
           (iVar3 = xmlC14NIsXmlNs(pxVar9->ns), iVar3 == 0)) {
LAB_00138718:
          if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
             (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,cur), pxVar2 = local_38,
             iVar3 != 0)) {
            xmlListInsert(l,pxVar9);
            pxVar2 = local_38;
          }
        }
        else if ((local_38 != (xmlNodePtr)0x0) ||
                (iVar3 = xmlStrEqual(pxVar9->name,"lang"), pxVar2 = pxVar9, iVar3 == 0)) {
          if (data == (xmlNodePtr)0x0) {
            iVar3 = xmlStrEqual(pxVar9->name,"space");
            bVar10 = iVar3 == 0;
            data = (xmlNodePtr)0x0;
            if (!bVar10) {
              data = pxVar9;
            }
            in_RCX = (xmlChar *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar10);
            if (!bVar10 || local_40 != (xmlNodePtr)0x0) {
              pxVar2 = local_38;
              if (iVar3 == 0) goto LAB_00138718;
              goto LAB_0013873c;
            }
          }
          else if (local_40 != (xmlNodePtr)0x0) goto LAB_00138718;
          iVar3 = xmlStrEqual(pxVar9->name,"base");
          local_40 = pxVar9;
          pxVar2 = local_38;
          if (iVar3 == 0) {
            local_40 = (xmlNodePtr)0x0;
            goto LAB_00138718;
          }
        }
LAB_0013873c:
        local_38 = pxVar2;
        pxVar9 = pxVar9->next;
      } while (pxVar9 != (_xmlNode *)0x0);
      if (parent_visible != 0) {
        if (local_38 == (xmlNodePtr)0x0) goto LAB_0013880d;
        goto LAB_00138829;
      }
    }
  }
  else if (xVar1 == XML_C14N_EXCLUSIVE_1_0) {
    pxVar9 = (xmlNodePtr)cur->properties;
    if (pxVar9 != (xmlNodePtr)0x0) {
      local_40 = (xmlNodePtr)0x0;
      do {
        if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
           (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,cur), iVar3 != 0)) {
          xmlListInsert(l,pxVar9);
        }
        pxVar9 = pxVar9->next;
      } while (pxVar9 != (_xmlNode *)0x0);
      goto LAB_00138a25;
    }
  }
  else if (xVar1 == XML_C14N_1_0) {
    for (pxVar9 = (xmlNodePtr)cur->properties; pxVar9 != (xmlNodePtr)0x0; pxVar9 = pxVar9->next) {
      if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
         (iVar3 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,cur), iVar3 != 0)) {
        xmlListInsert(l,pxVar9);
      }
    }
    if ((((parent_visible != 0) && (pxVar9 = cur->parent, pxVar9 != (xmlNodePtr)0x0)) &&
        (ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0)) &&
       ((iVar3 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,pxVar9->parent), iVar3 == 0 &&
        (p_Var8 = cur->parent, p_Var8 != (_xmlNode *)0x0)))) {
      local_40 = (xmlNodePtr)0x0;
      do {
        for (data_00 = p_Var8->properties; data_00 != (_xmlAttr *)0x0; data_00 = data_00->next) {
          if (((data_00->ns != (xmlNsPtr)0x0) && (iVar3 = xmlC14NIsXmlNs(data_00->ns), iVar3 != 0))
             && (pvVar5 = xmlListSearch(l,data_00), pvVar5 == (void *)0x0)) {
            xmlListInsert(l,data_00);
          }
        }
        p_Var8 = p_Var8->parent;
      } while (p_Var8 != (_xmlNode *)0x0);
      goto LAB_00138a25;
    }
  }
LAB_00138a23:
  local_40 = (xmlNodePtr)0x0;
LAB_00138a25:
  xmlListWalk(l,xmlC14NPrintAttrs,ctx);
  xmlFreePropList((xmlAttrPtr)local_40);
  xmlListDelete(l);
  return 0;
}

Assistant:

static int
xmlC14NProcessAttrsAxis(xmlC14NCtxPtr ctx, xmlNodePtr cur, int parent_visible)
{
    xmlAttrPtr attr;
    xmlListPtr list;
    xmlAttrPtr attrs_to_delete = NULL;

    /* special processing for 1.1 spec */
    xmlAttrPtr xml_base_attr = NULL;
    xmlAttrPtr xml_lang_attr = NULL;
    xmlAttrPtr xml_space_attr = NULL;

    if ((ctx == NULL) || (cur == NULL) || (cur->type != XML_ELEMENT_NODE)) {
        xmlC14NErrParam("processing attributes axis");
        return (-1);
    }

    /*
     * Create a sorted list to store element attributes
     */
    list = xmlListCreate(NULL, xmlC14NAttrsCompare);
    if (list == NULL) {
        xmlC14NErrInternal("creating attributes list");
        return (-1);
    }

    switch(ctx->mode) {
    case XML_C14N_1_0:
        /* The processing of an element node E MUST be modified slightly when an XPath node-set is
         * given as input and the element's parent is omitted from the node-set. The method for processing
         * the attribute axis of an element E in the node-set is enhanced. All element nodes along E's
         * ancestor axis are examined for nearest occurrences of attributes in the xml namespace, such
         * as xml:lang and xml:space (whether or not they are in the node-set). From this list of attributes,
         * remove any that are in E's attribute axis (whether or not they are in the node-set). Then,
         * lexicographically merge this attribute list with the nodes of E's attribute axis that are in
         * the node-set. The result of visiting the attribute axis is computed by processing the attribute
         * nodes in this merged attribute list.
         */

        /*
         * Add all visible attributes from current node.
         */
        attr = cur->properties;
        while (attr != NULL) {
            /* check that attribute is visible */
            if (xmlC14NIsVisible(ctx, attr, cur)) {
                xmlListInsert(list, attr);
            }
            attr = attr->next;
        }

        /*
         * Handle xml attributes
         */
        if (parent_visible && (cur->parent != NULL) &&
            (!xmlC14NIsVisible(ctx, cur->parent, cur->parent->parent)))
        {
            xmlNodePtr tmp;

            /*
             * If XPath node-set is not specified then the parent is always
             * visible!
             */
            tmp = cur->parent;
            while (tmp != NULL) {
                attr = tmp->properties;
                while (attr != NULL) {
                    if (xmlC14NIsXmlAttr(attr) != 0) {
                        if (xmlListSearch(list, attr) == NULL) {
                            xmlListInsert(list, attr);
                        }
                    }
                    attr = attr->next;
                }
                tmp = tmp->parent;
            }
        }

        /* done */
        break;
    case XML_C14N_EXCLUSIVE_1_0:
        /* attributes in the XML namespace, such as xml:lang and xml:space
         * are not imported into orphan nodes of the document subset
         */

        /*
         * Add all visible attributes from current node.
         */
        attr = cur->properties;
        while (attr != NULL) {
            /* check that attribute is visible */
            if (xmlC14NIsVisible(ctx, attr, cur)) {
                xmlListInsert(list, attr);
            }
            attr = attr->next;
        }

        /* do nothing special for xml attributes */
        break;
    case XML_C14N_1_1:
        /* The processing of an element node E MUST be modified slightly when an XPath node-set is
         * given as input and some of the element's ancestors are omitted from the node-set.
         *
         * Simple inheritable attributes are attributes that have a value that requires at most a simple
         * redeclaration. This redeclaration is done by supplying a new value in the child axis. The
         * redeclaration of a simple inheritable attribute A contained in one of E's ancestors is done
         * by supplying a value to an attribute Ae inside E with the same name. Simple inheritable attributes
         * are xml:lang and xml:space.
         *
         * The method for processing the attribute axis of an element E in the node-set is hence enhanced.
         * All element nodes along E's ancestor axis are examined for the nearest occurrences of simple
         * inheritable attributes in the xml namespace, such as xml:lang and xml:space (whether or not they
         * are in the node-set). From this list of attributes, any simple inheritable attributes that are
         * already in E's attribute axis (whether or not they are in the node-set) are removed. Then,
         * lexicographically merge this attribute list with the nodes of E's attribute axis that are in
         * the node-set. The result of visiting the attribute axis is computed by processing the attribute
         * nodes in this merged attribute list.
         *
         * The xml:id attribute is not a simple inheritable attribute and no processing of these attributes is
         * performed.
         *
         * The xml:base attribute is not a simple inheritable attribute and requires special processing beyond
         * a simple redeclaration.
         *
         * Attributes in the XML namespace other than xml:base, xml:id, xml:lang, and xml:space MUST be processed
         * as ordinary attributes.
         */

        /*
         * Add all visible attributes from current node.
         */
        attr = cur->properties;
        while (attr != NULL) {
            /* special processing for XML attribute kiks in only when we have invisible parents */
            if ((!parent_visible) || (xmlC14NIsXmlAttr(attr) == 0)) {
                /* check that attribute is visible */
                if (xmlC14NIsVisible(ctx, attr, cur)) {
                    xmlListInsert(list, attr);
                }
            } else {
                int matched = 0;

                /* check for simple inheritance attributes */
                if((!matched) && (xml_lang_attr == NULL) && xmlStrEqual(attr->name, BAD_CAST "lang")) {
                    xml_lang_attr = attr;
                    matched = 1;
                }
                if((!matched) && (xml_space_attr == NULL) && xmlStrEqual(attr->name, BAD_CAST "space")) {
                    xml_space_attr = attr;
                    matched = 1;
                }

                /* check for base attr */
                if((!matched) && (xml_base_attr == NULL) && xmlStrEqual(attr->name, BAD_CAST "base")) {
                    xml_base_attr = attr;
                    matched = 1;
                }

                /* otherwise, it is a normal attribute, so just check if it is visible */
                if((!matched) && xmlC14NIsVisible(ctx, attr, cur)) {
                    xmlListInsert(list, attr);
                }
            }

            /* move to the next one */
            attr = attr->next;
        }

        /* special processing for XML attribute kiks in only when we have invisible parents */
        if ((parent_visible)) {

            /* simple inheritance attributes - copy */
            if(xml_lang_attr == NULL) {
                xml_lang_attr = xmlC14NFindHiddenParentAttr(ctx, cur->parent, BAD_CAST "lang", XML_XML_NAMESPACE);
            }
            if(xml_lang_attr != NULL) {
                xmlListInsert(list, xml_lang_attr);
            }
            if(xml_space_attr == NULL) {
                xml_space_attr = xmlC14NFindHiddenParentAttr(ctx, cur->parent, BAD_CAST "space", XML_XML_NAMESPACE);
            }
            if(xml_space_attr != NULL) {
                xmlListInsert(list, xml_space_attr);
            }

            /* base uri attribute - fix up */
            if(xml_base_attr == NULL) {
                /* if we don't have base uri attribute, check if we have a "hidden" one above */
                xml_base_attr = xmlC14NFindHiddenParentAttr(ctx, cur->parent, BAD_CAST "base", XML_XML_NAMESPACE);
            }
            if(xml_base_attr != NULL) {
                xml_base_attr = xmlC14NFixupBaseAttr(ctx, xml_base_attr);
                if(xml_base_attr != NULL) {
                    xmlListInsert(list, xml_base_attr);

                    /* note that we MUST delete returned attr node ourselves! */
                    xml_base_attr->next = attrs_to_delete;
                    attrs_to_delete = xml_base_attr;
                }
            }
        }

        /* done */
        break;
    }

    /*
     * print out all elements from list
     */
    xmlListWalk(list, xmlC14NPrintAttrs, (void *) ctx);

    /*
     * Cleanup
     */
    xmlFreePropList(attrs_to_delete);
    xmlListDelete(list);
    return (0);
}